

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::roll(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint Value;
  ulong index;
  
  requireDStackDepth(this,1,"ROLL");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar1 != 0) {
    requireDStackDepth(this,(ulong)(uVar1 + 1),"ROLL");
    index = (ulong)uVar1;
    Value = ForthStack<unsigned_int>::getTop(this_00,index);
    ForthStack<unsigned_int>::moveStack(this_00,index,(ulong)(uVar1 - 1),index);
    ForthStack<unsigned_int>::setTop(this_00,Value);
    return;
  }
  return;
}

Assistant:

void roll() {
			REQUIRE_DSTACK_DEPTH(1, "ROLL");
			auto n = dStack.getTop(); pop();
			if (n > 0) {
				REQUIRE_DSTACK_DEPTH(n + 1, "ROLL");
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}